

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O2

void randomize_list(read_list_t *read_list,ui32_t check_total)

{
  ui32_t uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  read_list_t *prVar5;
  ulong uVar6;
  read_list_t t;
  
  uVar6 = 0;
  prVar5 = read_list;
  do {
    if (check_total == uVar6) {
      return;
    }
    if (randomize_list::seq < 4) {
      if (randomize_list::seq == 0) goto LAB_00103b64;
    }
    else {
      randomize_list::seq = 0;
LAB_00103b64:
      Kumu::FortunaRNG::FillRandom(&s_RNG,0x109210);
    }
    uVar1 = randomize_list::seq + 1;
    uVar4 = (ulong)randomize_list::tmp_ints[randomize_list::seq] % (ulong)(check_total - 1);
    randomize_list::seq = uVar1;
    if (uVar6 != uVar4) {
      uVar2 = *(undefined4 *)((long)&read_list[uVar4].position + 4);
      uVar3 = *(undefined8 *)(read_list + uVar4);
      *(undefined4 *)((long)&read_list[uVar4].position + 4) =
           *(undefined4 *)((long)&prVar5->position + 4);
      *(undefined8 *)(read_list + uVar4) = *(undefined8 *)prVar5;
      *(undefined4 *)((long)&prVar5->position + 4) = uVar2;
      *(undefined8 *)prVar5 = uVar3;
    }
    uVar6 = uVar6 + 1;
    prVar5 = prVar5 + 1;
  } while( true );
}

Assistant:

void
randomize_list(read_list_t* read_list, ui32_t check_total)
{
  static ui32_t tmp_ints[4];
  static ui32_t seq = 0;

  for ( ui32_t j = 0; j < check_total; j++ )
    {
      if ( seq > 3 )
	seq = 0;

      if ( seq == 0 )
	s_RNG.FillRandom((byte_t*)tmp_ints, 16);

      ui32_t i = tmp_ints[seq++] % (check_total - 1);

      if ( i == j )
	continue;

      read_list_t t = read_list[i];
      read_list[i] = read_list[j];
      read_list[j] = t;
    }
}